

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

int bssl::anon_unknown_0::ssl_test_ticket_aead_seal
              (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t *in,size_t in_len)

{
  int idx;
  void *pvVar1;
  ssl_test_ticket_aead_state *state;
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_len_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SSL *ssl_local;
  
  idx = ssl_test_ticket_aead_get_ex_index();
  pvVar1 = SSL_get_ex_data((SSL *)ssl,idx);
  if ((*(int *)((long)pvVar1 + 4) == 1) || (max_out_len < in_len + 1)) {
    ssl_local._4_4_ = 0;
  }
  else {
    OPENSSL_memmove(out,in,in_len);
    out[in_len] = 0xff;
    *out_len = in_len + 1;
    ssl_local._4_4_ = 1;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_test_ticket_aead_seal(SSL *ssl, uint8_t *out, size_t *out_len,
                                     size_t max_out_len, const uint8_t *in,
                                     size_t in_len) {
  auto state = reinterpret_cast<ssl_test_ticket_aead_state *>(
      SSL_get_ex_data(ssl, ssl_test_ticket_aead_get_ex_index()));

  if (state->failure_mode == ssl_test_ticket_aead_seal_fail ||
      max_out_len < in_len + 1) {
    return 0;
  }

  OPENSSL_memmove(out, in, in_len);
  out[in_len] = 0xff;
  *out_len = in_len + 1;

  return 1;
}